

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O0

BigInt * __thiscall BigInt::to_string_abi_cxx11_(BigInt *this)

{
  bool bVar1;
  _Setfill<char> _Var2;
  _Setw _Var3;
  reference pvVar4;
  size_type sVar5;
  ostream *poVar6;
  vector<long_long,_std::allocator<long_long>_> *in_RSI;
  longlong local_1e0;
  int local_1b0;
  int i;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [384];
  BigInt *this_local;
  
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  if (*(int *)&in_RSI[1].super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
               super__Vector_impl_data._M_start == -1) {
    std::operator<<(local_190,'-');
  }
  bVar1 = std::vector<long_long,_std::allocator<long_long>_>::empty(in_RSI);
  if (bVar1) {
    local_1e0 = 0;
  }
  else {
    pvVar4 = std::vector<long_long,_std::allocator<long_long>_>::back(in_RSI);
    local_1e0 = *pvVar4;
  }
  std::ostream::operator<<(local_190,local_1e0);
  sVar5 = std::vector<long_long,_std::allocator<long_long>_>::size(in_RSI);
  for (local_1b0 = (int)sVar5 + -2; -1 < local_1b0; local_1b0 = local_1b0 + -1) {
    _Var3 = std::setw(base_digits);
    poVar6 = std::operator<<(local_190,_Var3);
    _Var2 = std::setfill<char>('0');
    poVar6 = std::operator<<(poVar6,_Var2._M_c);
    pvVar4 = std::vector<long_long,_std::allocator<long_long>_>::operator[](in_RSI,(long)local_1b0);
    std::ostream::operator<<(poVar6,*pvVar4);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return this;
}

Assistant:

string to_string() {
        stringstream ss;
        //!send sign
        if (sign == NEGATIVE)
            ss << '-';

        //!get the last element
        ss << (vector_value.empty() ? 0 : vector_value.back());

        //!continue from the back
        for (int i = (int) vector_value.size() - 2; i >= 0; --i)
            ss << setw(base_digits)/*!width*/ << setfill('0')/*!empty placeholder*/ << vector_value[i]/*!number*/;

        return ss.str();
    }